

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurayHelper.cpp
# Opt level: O0

void __thiscall BlurayHelper::setVolumeLabel(BlurayHelper *this,string *label)

{
  IsoWriter *this_00;
  string local_38;
  string *local_18;
  string *label_local;
  BlurayHelper *this_local;
  
  if (this->m_isoWriter != (IsoWriter *)0x0) {
    this_00 = this->m_isoWriter;
    local_18 = label;
    label_local = (string *)this;
    unquoteStr(&local_38,label);
    IsoWriter::setVolumeLabel(this_00,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void BlurayHelper::setVolumeLabel(const std::string& label) const
{
    if (m_isoWriter)
        m_isoWriter->setVolumeLabel(unquoteStr(label));
}